

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ListBoxFooter(void)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiWindow *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiContext *pIVar7;
  ImGuiWindow *pIVar8;
  ImVec2 local_18;
  
  pIVar8 = GetParentWindow();
  pIVar6 = GImGui;
  fVar1 = (pIVar8->DC).LastItemRect.Min.x;
  fVar2 = (pIVar8->DC).LastItemRect.Min.y;
  fVar3 = (pIVar8->DC).LastItemRect.Max.x;
  fVar4 = (pIVar8->DC).LastItemRect.Max.y;
  EndChild();
  PopStyleVar(2);
  PopStyleColor(1);
  pIVar7 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  pIVar5->Accessed = true;
  if (pIVar5->SkipItems == false) {
    (pIVar5->DC).CursorPos.x = (pIVar7->Style).ItemSpacing.x + (pIVar5->DC).CursorPosPrevLine.x;
    (pIVar5->DC).CursorPos.y = (pIVar5->DC).CursorPosPrevLine.y;
    (pIVar5->DC).CurrentLineHeight = (pIVar5->DC).PrevLineHeight;
    (pIVar5->DC).CurrentLineTextBaseOffset = (pIVar5->DC).PrevLineTextBaseOffset;
  }
  (pIVar8->DC).CursorPos.x = fVar1;
  (pIVar8->DC).CursorPos.y = fVar2;
  local_18.y = fVar4 - fVar2;
  local_18.x = fVar3 - fVar1;
  ItemSize(&local_18,(pIVar6->Style).FramePadding.y);
  EndGroup();
  return;
}

Assistant:

void ImGui::ListBoxFooter()
{
    ImGuiWindow* parent_window = GetParentWindow();
    const ImRect bb = parent_window->DC.LastItemRect;
    const ImGuiStyle& style = GetStyle();

    EndChildFrame();

    // Redeclare item size so that it includes the label (we have stored the full size in LastItemRect)
    // We call SameLine() to restore DC.CurrentLine* data
    SameLine();
    parent_window->DC.CursorPos = bb.Min;
    ItemSize(bb, style.FramePadding.y);
    EndGroup();
}